

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O2

int mem_zuncompress_and_write(int hdl,void *buffer,long nbytes)

{
  char *err_message;
  int status;
  size_t newsize;
  
  status = 0;
  if (memTable[hdl].currentpos == 0) {
    uncompress2mem_from_mem
              ((char *)buffer,nbytes,memTable[hdl].memaddrptr,memTable[hdl].memsizeptr,
               memTable[hdl].mem_realloc,&newsize,&status);
    if (status == 0) {
      memTable[hdl].currentpos = memTable[hdl].currentpos + newsize;
      memTable[hdl].fitsfilesize = newsize;
      return 0;
    }
    err_message = "unabled to uncompress memory file (mem_uncompress_and_write)";
  }
  else {
    err_message = "cannot append uncompressed data (mem_uncompress_and_write)";
  }
  ffpmsg(err_message);
  return 0x6a;
}

Assistant:

int mem_zuncompress_and_write(int hdl, void *buffer, long nbytes)
/*
  uncompress input buffer, length nbytes and write bytes to current
  position in file.  output buffer needs to be at position 0 to start.
*/
{
  size_t newsize;
  int status = 0;

  if (memTable[hdl].currentpos != 0) {
      ffpmsg("cannot append uncompressed data (mem_uncompress_and_write)");
      return(WRITE_ERROR);
  }

  uncompress2mem_from_mem(buffer, nbytes,
			  memTable[hdl].memaddrptr,
			  memTable[hdl].memsizeptr,
			  memTable[hdl].mem_realloc, 
			  &newsize, &status);
  
  if (status) {
    ffpmsg("unabled to uncompress memory file (mem_uncompress_and_write)");
    return(WRITE_ERROR);
  }

  memTable[hdl].currentpos += newsize;
  memTable[hdl].fitsfilesize = newsize;
  return(0);
}